

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O1

void VP8IteratorInit(VP8Encoder *enc,VP8EncIterator *it)

{
  VP8Encoder *pVVar1;
  int iVar2;
  uint8_t *puVar3;
  
  it->enc_ = enc;
  puVar3 = (uint8_t *)((ulong)(it->yuv_mem_ + 0x1f) & 0xffffffffffffffe0);
  it->yuv_in_ = puVar3;
  it->yuv_out_ = puVar3 + 0x200;
  it->yuv_out2_ = puVar3 + 0x400;
  it->yuv_p_ = puVar3 + 0x600;
  it->lf_stats_ = enc->lf_stats_;
  it->percent0_ = enc->percent_;
  puVar3 = (uint8_t *)((ulong)(it->yuv_left_mem_ + 0x20) & 0xffffffffffffffe0);
  it->y_left_ = puVar3;
  it->u_left_ = puVar3 + 0x20;
  it->v_left_ = puVar3 + 0x30;
  it->top_derr_ = enc->top_derr_;
  VP8IteratorSetRow(it,0);
  iVar2 = enc->mb_h_ * enc->mb_w_;
  it->count_down0_ = iVar2;
  it->count_down_ = iVar2;
  pVVar1 = it->enc_;
  memset(pVVar1->y_top_,0x7f,(long)pVVar1->mb_w_ << 5);
  memset(pVVar1->nz_,0,(long)pVVar1->mb_w_ << 2);
  if (pVVar1->top_derr_ != (DError *)0x0) {
    memset(pVVar1->top_derr_,0,(long)pVVar1->mb_w_ << 2);
  }
  it->bit_count_[3][1] = 0;
  it->bit_count_[3][2] = 0;
  it->bit_count_[2][2] = 0;
  it->bit_count_[3][0] = 0;
  it->bit_count_[2][0] = 0;
  it->bit_count_[2][1] = 0;
  it->bit_count_[1][1] = 0;
  it->bit_count_[1][2] = 0;
  it->bit_count_[0][2] = 0;
  it->bit_count_[1][0] = 0;
  it->bit_count_[0][0] = 0;
  it->bit_count_[0][1] = 0;
  it->do_trellis_ = 0;
  return;
}

Assistant:

void VP8IteratorInit(VP8Encoder* const enc, VP8EncIterator* const it) {
  it->enc_ = enc;
  it->yuv_in_   = (uint8_t*)WEBP_ALIGN(it->yuv_mem_);
  it->yuv_out_  = it->yuv_in_ + YUV_SIZE_ENC;
  it->yuv_out2_ = it->yuv_out_ + YUV_SIZE_ENC;
  it->yuv_p_    = it->yuv_out2_ + YUV_SIZE_ENC;
  it->lf_stats_ = enc->lf_stats_;
  it->percent0_ = enc->percent_;
  it->y_left_ = (uint8_t*)WEBP_ALIGN(it->yuv_left_mem_ + 1);
  it->u_left_ = it->y_left_ + 16 + 16;
  it->v_left_ = it->u_left_ + 16;
  it->top_derr_ = enc->top_derr_;
  VP8IteratorReset(it);
}